

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult *
iutest::internal::CmpHelperMemCmpNE<TestObjectX>
          (AssertionResult *__return_storage_ptr__,char *expected_str,char *actual_str,
          TestObjectX *expected,TestObjectX *actual)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pcVar4;
  AssertionResult *pAVar5;
  TestObjectX *pTVar6;
  char *local_80;
  char *local_78;
  string local_70;
  AssertionResult local_50;
  
  uVar2._0_4_ = actual->a;
  uVar2._4_4_ = actual->b;
  uVar3._0_4_ = expected->a;
  uVar3._4_4_ = expected->b;
  pTVar6 = (TestObjectX *)((ulong)(uint)(actual->c ^ expected->c) | uVar2 ^ uVar3);
  if (pTVar6 == (TestObjectX *)0x0) {
    paVar1 = &local_50.m_message.field_2;
    local_50.m_message._M_string_length = 0;
    local_50.m_message.field_2._M_local_buf[0] = '\0';
    local_50.m_result = false;
    local_80 = actual_str;
    local_78 = expected_str;
    local_50.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar5 = AssertionResult::operator<<(&local_50,(char (*) [18])"error: Expected: ");
    pAVar5 = AssertionResult::operator<<(pAVar5,&local_78);
    pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [5])" != ");
    pAVar5 = AssertionResult::operator<<(pAVar5,&local_80);
    pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [12])0x337e3d);
    FormatForComparisonFailureMessage<TestObjectX,TestObjectX>
              (&local_70,(internal *)expected,actual,pTVar6);
    pAVar5 = AssertionResult::operator<<(pAVar5,&local_70);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar4 = (pAVar5->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + (pAVar5->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar5->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.m_message._M_dataplus._M_p,
                      CONCAT71(local_50.m_message.field_2._M_allocated_capacity._1_7_,
                               local_50.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperMemCmpNE(const char* expected_str, const char* actual_str
    , const T& expected, const T& actual)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()

    if IUTEST_COND_LIKELY( memcmp(&actual, &expected, sizeof(T)) != 0 )
    {
        return AssertionSuccess();
    }